

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cc
# Opt level: O3

NodePtr __thiscall avro::makeNode(avro *this,Entity *e,SymbolTable *st,string *ns)

{
  EntityType EVar1;
  element_type *peVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
  *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  _func_int **pp_Var6;
  undefined8 uVar7;
  undefined8 uVar8;
  shared_ptr<avro::Node> *psVar9;
  pointer psVar10;
  pointer psVar11;
  undefined8 this_00;
  any aVar12;
  int iVar13;
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *psVar14;
  shared_ptr<std::vector<avro::json::Entity,_std::allocator<avro::json::Entity>_>_> *psVar15;
  NodeUnion *this_01;
  element_type *extraout_RAX;
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>_>
  *psVar16;
  string *psVar17;
  long lVar18;
  string *simpleName;
  iterator iVar19;
  NodeSymbolic *this_02;
  int64_t iVar20;
  NodeFixed *p;
  NodeRecord *pNVar21;
  const_iterator cVar22;
  const_iterator cVar23;
  mapped_type *pmVar24;
  element_type *extraout_RAX_00;
  element_type *peVar25;
  Exception *pEVar26;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar27;
  sp_counted_base *extraout_RDX;
  _Rb_tree_header *p_Var28;
  sp_counted_base *extraout_RDX_00;
  shared_count sVar29;
  pointer pEVar30;
  pointer *this_03;
  NodePtr NVar31;
  NodePtr node;
  NodePtr result;
  Name n;
  MultiAttribute<boost::shared_ptr<avro::Node>_> mm;
  NodePtr result_1;
  GenericDatum d;
  MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  fieldNames;
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> defaultValues;
  NodePtr r;
  undefined1 local_228 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  shared_ptr<avro::Node> *local_208;
  string *local_200;
  MultiLeaves local_1f8;
  Name local_1d8;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  _Alloc_hider local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168 [11];
  element_type *local_b8;
  any local_b0;
  Type local_a8 [2];
  long *local_a0;
  put_holder<char,_std::char_traits<char>_> local_98;
  Array *local_80;
  GenericDatum local_78;
  NodePtr local_68;
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> local_58;
  shared_ptr<avro::Node> local_40;
  
  EVar1 = e->type_;
  local_208 = (shared_ptr<avro::Node> *)this;
  local_200 = (string *)st;
  if (EVar1 == etObject) {
    json::Entity::ensureType(e,etObject);
    psVar16 = boost::
              any_cast<boost::shared_ptr<std::map<std::__cxx11::string,avro::json::Entity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>>>
                        (&e->value_);
    p_Var3 = &psVar16->px->_M_t;
    local_198._8_8_ = (pointer)0x4;
    local_188._0_5_ = 0x65707974;
    local_198._0_8_ =
         (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
          *)local_188;
    psVar17 = getStringField(e,(Object *)p_Var3,(string *)local_198);
    if ((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
         *)local_198._0_8_ !=
        (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
         *)local_188) {
      operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
    }
    makePrimitive((avro *)&local_b8,psVar17);
    aVar12.content = local_b0.content;
    if (local_b8 == (element_type *)0x0) {
      iVar13 = std::__cxx11::string::compare((char *)psVar17);
      if (iVar13 != 0) {
        iVar13 = std::__cxx11::string::compare((char *)psVar17);
        if (iVar13 != 0) {
          iVar13 = std::__cxx11::string::compare((char *)psVar17);
          if (iVar13 != 0) {
            iVar13 = std::__cxx11::string::compare((char *)psVar17);
            if (iVar13 != 0) {
              iVar13 = std::__cxx11::string::compare((char *)psVar17);
              if (iVar13 == 0) {
                makeArrayNode((Entity *)local_208,(Object *)e,(SymbolTable *)p_Var3,local_200);
              }
              else {
                iVar13 = std::__cxx11::string::compare((char *)psVar17);
                if (iVar13 != 0) {
                  boost::detail::shared_count::~shared_count((shared_count *)&local_b0);
                  pEVar26 = (Exception *)__cxa_allocate_exception(0x18);
                  boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::
                  basic_format((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_198,"Unknown type definition: %1%");
                  json::Entity::toString_abi_cxx11_(&local_1d8.ns_,e);
                  local_228._8_8_ =
                       boost::io::detail::
                       call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
                  local_218._M_allocated_capacity =
                       (size_type)
                       boost::io::detail::
                       call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
                  local_228._0_8_ = &local_1d8;
                  pbVar27 = boost::io::detail::
                            feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                                      ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_198,
                                       (put_holder<char,_std::char_traits<char>_> *)local_228);
                  Exception::Exception(pEVar26,pbVar27);
                  __cxa_throw(pEVar26,&Exception::typeinfo,Exception::~Exception);
                }
                makeMapNode((Entity *)local_208,(Object *)e,(SymbolTable *)p_Var3,local_200);
              }
              goto LAB_001416c4;
            }
          }
        }
      }
      local_198._8_8_ = (pointer)0x4;
      local_188._0_5_ = 0x656d616e;
      local_198._0_8_ = (pointer)local_188;
      simpleName = getStringField(e,(Object *)p_Var3,(string *)local_198);
      if ((pointer)local_198._0_8_ != (pointer)local_188) {
        operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
      }
      lVar18 = std::__cxx11::string::find((char)simpleName,0x2e);
      if (lVar18 == -1) {
        local_198._0_8_ = local_188;
        local_188._0_8_ = (pointer)0x63617073656d616e;
        local_188._8_2_ = 0x65;
        local_198._8_8_ = (pointer)0x9;
        cVar23 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                 ::find(p_Var3,(key_type *)local_198);
        if ((pointer)local_198._0_8_ != (pointer)local_188) {
          operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
        }
        if ((_Rb_tree_header *)cVar23._M_node != &(p_Var3->_M_impl).super__Rb_tree_header) {
          if (cVar23._M_node[2]._M_color != 4) {
            pEVar26 = (Exception *)__cxa_allocate_exception(0x18);
            boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                      ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198,"Json field \"%1%\" is not a %2%: %3%");
            local_228._0_8_ = "namespace";
            local_228._8_8_ =
                 boost::io::detail::call_put_head<char,std::char_traits<char>,char_const[10]>;
            local_218._M_allocated_capacity =
                 (size_type)
                 boost::io::detail::call_put_last<char,std::char_traits<char>,char_const[10]>;
            pbVar27 = boost::io::detail::
                      feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_198,(put_holder<char,_std::char_traits<char>_> *)local_228
                                );
            local_228._0_8_ = &local_1f8;
            local_1f8.attrs_.
            super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x168305;
            local_228._8_8_ =
                 boost::io::detail::call_put_head<char,std::char_traits<char>,char_const*const>;
            local_218._M_allocated_capacity =
                 (size_type)
                 boost::io::detail::call_put_last<char,std::char_traits<char>,char_const*const>;
            pbVar27 = boost::io::detail::
                      feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                                (pbVar27,(put_holder<char,_std::char_traits<char>_> *)local_228);
            json::Entity::toString_abi_cxx11_((string *)local_228,(Entity *)(cVar23._M_node + 2));
            local_98.put_head =
                 boost::io::detail::
                 call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
            local_98.put_last =
                 boost::io::detail::
                 call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
            local_98.arg = local_228;
            pbVar27 = boost::io::detail::
                      feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                                (pbVar27,&local_98);
            Exception::Exception(pEVar26,pbVar27);
            __cxa_throw(pEVar26,&Exception::typeinfo,Exception::~Exception);
          }
          json::Entity::ensureType((Entity *)(cVar23._M_node + 2),etString);
          psVar14 = boost::any_cast<boost::shared_ptr<std::__cxx11::string>>
                              ((any *)&cVar23._M_node[2]._M_parent);
          ns = psVar14->px;
        }
        Name::Name(&local_1d8,simpleName,ns);
      }
      else {
        Name::Name(&local_1d8,simpleName);
      }
      local_208->px = (element_type *)0x0;
      ((any *)&local_208->pn)->content = (placeholder *)0x0;
      iVar13 = std::__cxx11::string::compare((char *)psVar17);
      if (iVar13 == 0) {
LAB_001410d2:
        pNVar21 = (NodeRecord *)operator_new(0xd0);
        (pNVar21->super_NodeImplRecord).super_Node.type_ = AVRO_RECORD;
        (pNVar21->super_NodeImplRecord).super_Node.locked_ = false;
        (pNVar21->super_NodeImplRecord).nameAttribute_.attr_.ns_._M_dataplus._M_p =
             (pointer)&(pNVar21->super_NodeImplRecord).nameAttribute_.attr_.ns_.field_2;
        (pNVar21->super_NodeImplRecord).nameAttribute_.attr_.ns_._M_string_length = 0;
        (pNVar21->super_NodeImplRecord).nameAttribute_.attr_.ns_.field_2._M_local_buf[0] = '\0';
        (pNVar21->super_NodeImplRecord).nameAttribute_.attr_.simpleName_._M_dataplus._M_p =
             (pointer)&(pNVar21->super_NodeImplRecord).nameAttribute_.attr_.simpleName_.field_2;
        (pNVar21->super_NodeImplRecord).nameAttribute_.attr_.simpleName_._M_string_length = 0;
        (pNVar21->super_NodeImplRecord).nameAttribute_.attr_.simpleName_.field_2._M_local_buf[0] =
             '\0';
        p_Var28 = &(pNVar21->super_NodeImplRecord).nameIndex_.map_._M_t._M_impl.
                   super__Rb_tree_header;
        (pNVar21->super_NodeImplRecord).nameIndex_.map_._M_t._M_impl.super__Rb_tree_header._M_header
        ._M_color = _S_red;
        (pNVar21->super_NodeImplRecord).nameIndex_.map_._M_t._M_impl.super__Rb_tree_header._M_header
        ._M_parent = (_Base_ptr)0x0;
        (pNVar21->super_NodeImplRecord).leafAttributes_.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar21->super_NodeImplRecord).leafAttributes_.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar21->super_NodeImplRecord).leafAttributes_.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pNVar21->super_NodeImplRecord).leafNameAttributes_.attrs_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar21->super_NodeImplRecord).leafNameAttributes_.attrs_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar21->super_NodeImplRecord).leafNameAttributes_.attrs_.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pNVar21->super_NodeImplRecord).nameIndex_.map_._M_t._M_impl.super__Rb_tree_header._M_header
        ._M_left = &p_Var28->_M_header;
        (pNVar21->super_NodeImplRecord).nameIndex_.map_._M_t._M_impl.super__Rb_tree_header._M_header
        ._M_right = &p_Var28->_M_header;
        (pNVar21->super_NodeImplRecord).nameIndex_.map_._M_t._M_impl.super__Rb_tree_header.
        _M_node_count = 0;
        (pNVar21->super_NodeImplRecord).super_Node._vptr_Node =
             (_func_int **)&PTR__NodeRecord_00180e18;
        (pNVar21->defaultValues).
        super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar21->defaultValues).
        super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar21->defaultValues).
        super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeRecord>
                  ((shared_ptr<avro::Node> *)local_228,pNVar21);
        psVar9 = local_208;
        uVar7 = local_228._8_8_;
        uVar5 = local_228._0_8_;
        local_228._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_228._8_8_ = (_Base_ptr)0x0;
        local_198._0_8_ = local_208->px;
        local_198._8_8_ = (local_208->pn).pi_;
        local_208->px = (element_type *)uVar5;
        (local_208->pn).pi_ = (sp_counted_base *)uVar7;
        boost::detail::shared_count::~shared_count((shared_count *)(local_198 + 8));
        boost::detail::shared_count::~shared_count((shared_count *)(local_228 + 8));
        pmVar24 = std::
                  map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                  ::operator[]((map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                                *)local_200,&local_1d8);
        boost::shared_ptr<avro::Node>::operator=(pmVar24,psVar9);
        local_198._8_8_ = (pointer)0x6;
        local_188._0_7_ = 0x73646c656966;
        local_198._0_8_ =
             (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
              *)local_188;
        local_80 = getArrayField(e,(Object *)p_Var3,(string *)local_198);
        if ((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
             *)local_198._0_8_ !=
            (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
             *)local_188) {
          operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
        }
        local_98.put_last =
             (_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_void_ptr *)0x0;
        local_98.arg = (void *)0x0;
        local_98.put_head =
             (_func_void_basic_ostream<char,_std::char_traits<char>_>_ptr_void_ptr *)0x0;
        local_1f8.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1f8.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1f8.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_58.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_58.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl
        .super__Vector_impl_data._M_start = (pointer)0x0;
        local_58.super__Vector_base<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>._M_impl
        .super__Vector_impl_data._M_finish = (pointer)0x0;
        pEVar30 = (local_80->
                  super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if (pEVar30 !=
            (local_80->super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
            _M_impl.super__Vector_impl_data._M_finish) {
          do {
            json::Entity::ensureType(pEVar30,etObject);
            psVar16 = boost::
                      any_cast<boost::shared_ptr<std::map<std::__cxx11::string,avro::json::Entity,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,avro::json::Entity>>>>>
                                (&pEVar30->value_);
            p_Var3 = &psVar16->px->_M_t;
            local_228._8_8_ = (sp_counted_base *)0x4;
            local_218._M_allocated_capacity._0_5_ = 0x656d616e;
            local_228._0_8_ = &local_218;
            psVar17 = getStringField(pEVar30,(Object *)p_Var3,(string *)local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._0_8_ != &local_218) {
              operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_allocated_capacity + 1));
            }
            local_228._8_8_ = (sp_counted_base *)0x4;
            local_218._M_allocated_capacity._0_5_ = 0x65707974;
            local_228._0_8_ = &local_218;
            cVar22 = findField(pEVar30,(Object *)p_Var3,(string *)local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._0_8_ != &local_218) {
              operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_allocated_capacity + 1));
            }
            local_218._M_allocated_capacity = 0x746c7561666564;
            local_228._8_8_ = (_Base_ptr)0x7;
            local_228._0_8_ = &local_218;
            cVar23 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_avro::json::Entity>_>_>
                     ::find(p_Var3,(key_type *)local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._0_8_ != &local_218) {
              operator_delete((void *)local_228._0_8_,(ulong)(local_218._M_allocated_capacity + 1));
            }
            makeNode((avro *)local_228,(Entity *)(cVar22._M_node + 2),(SymbolTable *)local_200,
                     &local_1d8.ns_);
            if ((_Rb_tree_header *)cVar23._M_node == &(p_Var3->_M_impl).super__Rb_tree_header) {
              local_a8[0] = AVRO_NULL;
              local_a0 = (long *)0x0;
              local_78.type_ = AVRO_NULL;
              local_78.value_.content = (placeholder *)0x0;
            }
            else {
              local_68.px = (element_type *)local_228._0_8_;
              local_68.pn.pi_ = (sp_counted_base *)local_228._8_8_;
              if ((_Base_ptr)local_228._8_8_ != (_Base_ptr)0x0) {
                LOCK();
                *(int *)(local_228._8_8_ + 8) = *(int *)(local_228._8_8_ + 8) + 1;
                UNLOCK();
              }
              makeGenericDatum((avro *)local_a8,&local_68,(Entity *)(cVar23._M_node + 2),
                               (SymbolTable *)local_200);
              boost::detail::shared_count::~shared_count(&local_68.pn);
              local_78.type_ = local_a8[0];
              if (local_a0 == (long *)0x0) {
                local_78.value_.content = (placeholder *)0x0;
              }
              else {
                local_78.value_.content = (placeholder *)(**(code **)(*local_a0 + 0x18))();
              }
            }
            Field::Field((Field *)local_198,psVar17,(NodePtr *)local_228,&local_78);
            if (local_78.value_.content != (placeholder *)0x0) {
              (*(local_78.value_.content)->_vptr_placeholder[1])();
            }
            if (local_a0 != (long *)0x0) {
              (**(code **)(*local_a0 + 8))();
            }
            boost::detail::shared_count::~shared_count((shared_count *)(local_228 + 8));
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_98,(value_type *)local_198._0_8_);
            std::
            vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
            push_back(&local_1f8.attrs_,(value_type *)(local_198 + 8));
            std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::push_back
                      (&local_58,(value_type *)(local_188 + 8));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_178._M_p !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              (**(code **)(*(size_type *)local_178._M_p + 8))();
            }
            boost::detail::shared_count::~shared_count((shared_count *)local_188);
            pEVar30 = pEVar30 + 1;
          } while (pEVar30 !=
                   (local_80->
                   super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
        }
        pNVar21 = (NodeRecord *)operator_new(0xd0);
        asSingleAttribute<avro::Name>((SingleAttribute<avro::Name> *)local_198,&local_1d8);
        NodeRecord::NodeRecord
                  (pNVar21,(HasName *)local_198,&local_1f8,(LeafNames *)&local_98,&local_58);
        boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeRecord>(&local_40,pNVar21);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_p != local_168) {
          operator_delete(local_178._M_p,local_168[0]._M_allocated_capacity + 1);
        }
        if ((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
             *)local_198._0_8_ !=
            (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
             *)local_188) {
          operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
        }
        std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::~vector(&local_58);
        std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ::~vector(&local_1f8.attrs_);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_98);
        boost::dynamic_pointer_cast<avro::NodeRecord,avro::Node>((boost *)local_198,&local_40);
        this_00 = local_198._0_8_;
        boost::dynamic_pointer_cast<avro::NodeRecord,avro::Node>((boost *)local_228,local_208);
        uVar8 = local_228._0_8_;
        NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
        ::swap((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                *)this_00,
               (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                *)local_228._0_8_);
        pcVar4 = (((SingleAttribute<avro::Name> *)(this_00 + 200))->attr_).ns_._M_dataplus._M_p;
        uVar5 = *(undefined8 *)(uVar8 + 0xc0);
        pp_Var6 = (((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
                     *)(this_00 + 0xb8))->super_Node)._vptr_Node;
        uVar7 = *(undefined8 *)(this_00 + 0xc0);
        (((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
           *)(this_00 + 0xb8))->super_Node)._vptr_Node = *(_func_int ***)(uVar8 + 0xb8);
        *(undefined8 *)(this_00 + 0xc0) = uVar5;
        (((SingleAttribute<avro::Name> *)(this_00 + 200))->attr_).ns_._M_dataplus._M_p =
             *(pointer *)(uVar8 + 200);
        *(_func_int ***)(uVar8 + 0xb8) = pp_Var6;
        *(undefined8 *)(uVar8 + 0xc0) = uVar7;
        *(pointer *)(uVar8 + 200) = pcVar4;
        boost::detail::shared_count::~shared_count((shared_count *)(local_228 + 8));
        boost::detail::shared_count::~shared_count((shared_count *)(local_198 + 8));
        boost::detail::shared_count::~shared_count(&local_40.pn);
      }
      else {
        iVar13 = std::__cxx11::string::compare((char *)psVar17);
        if (iVar13 == 0) goto LAB_001410d2;
        iVar13 = std::__cxx11::string::compare((char *)psVar17);
        if (iVar13 == 0) {
          makeEnumNode((avro *)&local_1f8,e,&local_1d8,(Object *)p_Var3);
        }
        else {
          local_198._8_8_ = (pointer)0x4;
          local_188._0_5_ = 0x657a6973;
          local_198._0_8_ = (pointer)local_188;
          iVar20 = getLongField(e,(Object *)p_Var3,(string *)local_198);
          if ((pointer)local_198._0_8_ != (pointer)local_188) {
            operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
          }
          if ((int)iVar20 < 1) {
            pEVar26 = (Exception *)__cxa_allocate_exception(0x18);
            boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                      ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_198,"Size for fixed is not positive: ");
            json::Entity::toString_abi_cxx11_((string *)local_228,e);
            local_98.put_head =
                 boost::io::detail::
                 call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
            local_98.put_last =
                 boost::io::detail::
                 call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
            local_98.arg = local_228;
            pbVar27 = boost::io::detail::
                      feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_198,&local_98);
            Exception::Exception(pEVar26,pbVar27);
            __cxa_throw(pEVar26,&Exception::typeinfo,Exception::~Exception);
          }
          p = (NodeFixed *)operator_new(0x60);
          asSingleAttribute<avro::Name>((SingleAttribute<avro::Name> *)local_198,&local_1d8);
          (p->super_NodeImplFixed).super_Node.type_ = AVRO_FIXED;
          (p->super_NodeImplFixed).super_Node.locked_ = false;
          (p->super_NodeImplFixed).super_Node._vptr_Node = (_func_int **)&PTR__NodeImpl_00180670;
          concepts::SingleAttribute<avro::Name>::SingleAttribute
                    (&(p->super_NodeImplFixed).nameAttribute_,
                     (SingleAttribute<avro::Name> *)local_198);
          (p->super_NodeImplFixed).sizeAttribute_.attr_ = (int)iVar20;
          (p->super_NodeImplFixed).super_Node._vptr_Node = (_func_int **)&PTR__NodeImpl_00181228;
          boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeFixed>
                    ((shared_ptr<avro::Node> *)&local_1f8,p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178._M_p != local_168) {
            operator_delete(local_178._M_p,local_168[0]._M_allocated_capacity + 1);
          }
          if ((pointer)local_198._0_8_ != (pointer)local_188) {
            operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
          }
        }
        psVar11 = local_1f8.attrs_.
                  super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        psVar10 = local_1f8.attrs_.
                  super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        psVar9 = local_208;
        local_1f8.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1f8.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_198._0_8_ = local_208->px;
        local_198._8_8_ = (local_208->pn).pi_;
        local_208->px = (element_type *)psVar10;
        (local_208->pn).pi_ = (sp_counted_base *)psVar11;
        boost::detail::shared_count::~shared_count((shared_count *)(local_198 + 8));
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &local_1f8.attrs_.
                    super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish);
        pmVar24 = std::
                  map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                  ::operator[]((map<avro::Name,_boost::shared_ptr<avro::Node>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                                *)local_200,&local_1d8);
        boost::shared_ptr<avro::Node>::operator=(pmVar24,psVar9);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.simpleName_._M_dataplus._M_p != &local_1d8.simpleName_.field_2) {
        operator_delete(local_1d8.simpleName_._M_dataplus._M_p,
                        local_1d8.simpleName_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.ns_._M_dataplus._M_p != &local_1d8.ns_.field_2) {
        operator_delete(local_1d8.ns_._M_dataplus._M_p,
                        local_1d8.ns_.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_208->px = local_b8;
      local_b0.content = (placeholder *)0x0;
      ((any *)&local_208->pn)->content = aVar12.content;
      local_b8 = (element_type *)0x0;
    }
LAB_001416c4:
    this_03 = (pointer *)&local_b0;
  }
  else {
    if (EVar1 == etArray) {
      json::Entity::ensureType(e,etArray);
      psVar15 = boost::
                any_cast<boost::shared_ptr<std::vector<avro::json::Entity,std::allocator<avro::json::Entity>>>>
                          (&e->value_);
      peVar2 = psVar15->px;
      local_198._0_8_ = (pointer)0x0;
      local_198._8_8_ = (pointer)0x0;
      local_188._0_8_ = (pointer)0x0;
      pEVar30 = (peVar2->super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (pEVar30 !=
          (peVar2->super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          makeNode((avro *)&local_1d8,pEVar30,(SymbolTable *)local_200,ns);
          std::
          vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
          push_back((vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
                     *)local_198,(value_type *)&local_1d8);
          boost::detail::shared_count::~shared_count
                    ((shared_count *)&local_1d8.ns_._M_string_length);
          pEVar30 = pEVar30 + 1;
        } while (pEVar30 !=
                 (peVar2->
                 super__Vector_base<avro::json::Entity,_std::allocator<avro::json::Entity>_>).
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      this_01 = (NodeUnion *)operator_new(0x30);
      NodeUnion::NodeUnion(this_01,(MultiLeaves *)local_198);
      boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeUnion>(local_208,this_01);
      std::vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>::
      ~vector((vector<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
               *)local_198);
      peVar25 = extraout_RAX;
      sVar29.pi_ = extraout_RDX;
      goto LAB_001416d1;
    }
    if (EVar1 != etString) {
      pEVar26 = (Exception *)__cxa_allocate_exception(0x18);
      boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                 "Invalid Avro type: %1%");
      json::Entity::toString_abi_cxx11_(&local_1d8.ns_,e);
      local_228._8_8_ =
           boost::io::detail::call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
      local_218._M_allocated_capacity =
           (size_type)
           boost::io::detail::call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
      local_228._0_8_ = &local_1d8;
      pbVar27 = boost::io::detail::
                feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                          ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_198,(put_holder<char,_std::char_traits<char>_> *)local_228);
      Exception::Exception(pEVar26,pbVar27);
      __cxa_throw(pEVar26,&Exception::typeinfo,Exception::~Exception);
    }
    json::Entity::ensureType(e,etString);
    psVar14 = boost::any_cast<boost::shared_ptr<std::__cxx11::string>>(&e->value_);
    psVar17 = psVar14->px;
    makePrimitive((avro *)&local_1f8,psVar17);
    psVar10 = local_1f8.attrs_.
              super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if ((element_type *)
        local_1f8.attrs_.
        super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
        ._M_impl.super__Vector_impl_data._M_start == (element_type *)0x0) {
      lVar18 = std::__cxx11::string::find((char)psVar17,0x2e);
      if (lVar18 == -1) {
        Name::Name(&local_1d8,psVar17,ns);
      }
      else {
        Name::Name(&local_1d8,psVar17);
      }
      psVar17 = local_200;
      iVar19 = std::
               _Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
               ::find((_Rb_tree<avro::Name,_std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>,_std::_Select1st<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>,_std::less<avro::Name>,_std::allocator<std::pair<const_avro::Name,_boost::shared_ptr<avro::Node>_>_>_>
                       *)local_200,&local_1d8);
      if (iVar19._M_node == (_Base_ptr)&psVar17->_M_string_length) {
        pEVar26 = (Exception *)__cxa_allocate_exception(0x18);
        boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                  ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198,
                   "Unknown type: %1%");
        Name::fullname_abi_cxx11_((string *)local_228,&local_1d8);
        local_98.put_head =
             boost::io::detail::
             call_put_head<char,std::char_traits<char>,std::__cxx11::string_const>;
        local_98.put_last =
             boost::io::detail::
             call_put_last<char,std::char_traits<char>,std::__cxx11::string_const>;
        local_98.arg = local_228;
        pbVar27 = boost::io::detail::
                  feed_impl<char,std::char_traits<char>,std::allocator<char>,boost::io::detail::put_holder<char,std::char_traits<char>>const&>
                            ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_198,&local_98);
        Exception::Exception(pEVar26,pbVar27);
        __cxa_throw(pEVar26,&Exception::typeinfo,Exception::~Exception);
      }
      this_02 = (NodeSymbolic *)operator_new(0x68);
      asSingleAttribute<avro::Name>((SingleAttribute<avro::Name> *)local_198,&local_1d8);
      local_228._0_8_ = *(undefined8 *)(iVar19._M_node + 3);
      local_228._8_8_ = iVar19._M_node[3]._M_parent;
      if ((_Base_ptr)local_228._8_8_ != (_Base_ptr)0x0) {
        LOCK();
        *(int *)&((_Base_ptr)local_228._8_8_)->_M_parent =
             *(int *)&((_Base_ptr)local_228._8_8_)->_M_parent + 1;
        UNLOCK();
      }
      NodeSymbolic::NodeSymbolic(this_02,(HasName *)local_198,(NodePtr *)local_228);
      boost::shared_ptr<avro::Node>::shared_ptr<avro::NodeSymbolic>(local_208,this_02);
      boost::detail::shared_count::~shared_count((shared_count *)(local_228 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_p != local_168) {
        operator_delete(local_178._M_p,local_168[0]._M_allocated_capacity + 1);
      }
      if ((NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
           *)local_198._0_8_ !=
          (NodeImpl<avro::concepts::SingleAttribute<avro::Name>,_avro::concepts::MultiAttribute<boost::shared_ptr<avro::Node>_>,_avro::concepts::MultiAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_avro::concepts::NoAttribute<int>_>
           *)local_188) {
        operator_delete((void *)local_198._0_8_,(ulong)(local_188._0_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.simpleName_._M_dataplus._M_p != &local_1d8.simpleName_.field_2) {
        operator_delete(local_1d8.simpleName_._M_dataplus._M_p,
                        local_1d8.simpleName_.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8.ns_._M_dataplus._M_p != &local_1d8.ns_.field_2) {
        operator_delete(local_1d8.ns_._M_dataplus._M_p,
                        local_1d8.ns_.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_208->px =
           (element_type *)
           local_1f8.attrs_.
           super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_1f8.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      ((any *)&local_208->pn)->content = (placeholder *)psVar10;
      local_1f8.attrs_.
      super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    this_03 = &local_1f8.attrs_.
               super__Vector_base<boost::shared_ptr<avro::Node>,_std::allocator<boost::shared_ptr<avro::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
  }
  boost::detail::shared_count::~shared_count((shared_count *)this_03);
  peVar25 = extraout_RAX_00;
  sVar29.pi_ = extraout_RDX_00;
LAB_001416d1:
  NVar31.pn.pi_ = sVar29.pi_;
  NVar31.px = peVar25;
  return NVar31;
}

Assistant:

static NodePtr makeNode(const json::Entity& e, SymbolTable& st, const string& ns)
{
    switch (e.type()) {
    case json::etString:
        return makeNode(e.stringValue(), st, ns);
    case json::etObject:
        return makeNode(e, e.objectValue(), st, ns);
    case json::etArray:
        return makeNode(e, e.arrayValue(), st, ns);
    default:
        throw Exception(boost::format("Invalid Avro type: %1%") % e.toString());
    }
}